

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O2

void __thiscall Unowned_Assign_Test::TestBody(Unowned_Assign_Test *this)

{
  char *pcVar1;
  AssertHelper local_48;
  unowned_ptr<int> b;
  AssertionResult gtest_ar;
  AssertHelper local_28;
  unowned_ptr<int> a;
  int i;
  
  i = 5;
  b._p = &i;
  a._p = &i;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,int*>
            ((internal *)&gtest_ar,"a","&i",&a,&b._p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&b);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x2b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&b);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&b);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  a._p = (int *)0x0;
  b._p = (int *)0x0;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,decltype(nullptr)>
            ((internal *)&gtest_ar,"a","nullptr",&a,&b._p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&b);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x2d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&b);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&b);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  a._p = (int *)0x0;
  b._p = (int *)0x0;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,decltype(nullptr)>
            ((internal *)&gtest_ar,"a","nullptr",&a,&b._p);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&b);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x2f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&b);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&b);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_48.data_ = (AssertHelperData *)&i;
  b._p = &i;
  a._p = &i;
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,int*>
            ((internal *)&gtest_ar,"a","&i",&a,(int **)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((internal *)&gtest_ar,"a","b",&a,&b);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Unowned, Assign)
{
    int i = 5;
    unowned_ptr<int> a { &i };
    EXPECT_EQ(a, &i);
    a = nullptr;
    EXPECT_EQ(a, nullptr);
    a = {};
    EXPECT_EQ(a, nullptr);
    unowned_ptr<int> b { &i };
    a = b;
    EXPECT_EQ(a, &i);
    EXPECT_EQ(a, b);

}